

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

void write_random_seed(void *data,int len)

{
  char *__file;
  int *piVar1;
  char *pcVar2;
  char *ptr;
  ssize_t sVar3;
  int ret;
  char *errmsg;
  char *dir;
  char *fname;
  int fd;
  int len_local;
  void *data_local;
  
  __file = make_filename(3,(char *)0x0);
  fname._0_4_ = open(__file,0x41,0x180);
  fname._4_4_ = len;
  _fd = data;
  if ((int)fname < 0) {
    piVar1 = __errno_location();
    if (*piVar1 != 2) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      nonfatal("Unable to write random seed: open(\"%s\") returned \'%s\'",__file,pcVar2);
      safefree(__file);
      return;
    }
    pcVar2 = make_filename(0,(char *)0x0);
    ptr = make_dir_path(pcVar2,0x1c0);
    if (ptr != (char *)0x0) {
      nonfatal("Unable to write random seed: %s",ptr);
      safefree(ptr);
      safefree(__file);
      safefree(pcVar2);
      return;
    }
    safefree(pcVar2);
    fname._0_4_ = open(__file,0x41,0x180);
    if ((int)fname < 0) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      nonfatal("Unable to write random seed: open(\"%s\") returned \'%s\'",__file,pcVar2);
      safefree(__file);
      return;
    }
  }
  do {
    if (fname._4_4_ < 1) {
LAB_00164fb6:
      close((int)fname);
      safefree(__file);
      return;
    }
    sVar3 = write((int)fname,_fd,(long)fname._4_4_);
    if ((int)sVar3 < 0) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      nonfatal("Unable to write random seed: write returned \'%s\'",pcVar2);
      goto LAB_00164fb6;
    }
    fname._4_4_ = fname._4_4_ - (int)sVar3;
    _fd = (void *)((long)_fd + (long)fname._4_4_);
  } while( true );
}

Assistant:

void write_random_seed(void *data, int len)
{
    int fd;
    char *fname;

    fname = make_filename(INDEX_RANDSEED, NULL);
    /*
     * Don't truncate the random seed file if it already exists; if
     * something goes wrong half way through writing it, it would
     * be better to leave the old data there than to leave it empty.
     */
    fd = open(fname, O_CREAT | O_WRONLY, 0600);
    if (fd < 0) {
        if (errno != ENOENT) {
            nonfatal("Unable to write random seed: open(\"%s\") "
                     "returned '%s'", fname, strerror(errno));
            sfree(fname);
            return;
        }
        char *dir, *errmsg;

        dir = make_filename(INDEX_DIR, NULL);
        if ((errmsg = make_dir_path(dir, 0700)) != NULL) {
            nonfatal("Unable to write random seed: %s", errmsg);
            sfree(errmsg);
            sfree(fname);
            sfree(dir);
            return;
        }
        sfree(dir);

        fd = open(fname, O_CREAT | O_WRONLY, 0600);
        if (fd < 0) {
            nonfatal("Unable to write random seed: open(\"%s\") "
                     "returned '%s'", fname, strerror(errno));
            sfree(fname);
            return;
        }
    }

    while (len > 0) {
        int ret = write(fd, data, len);
        if (ret < 0) {
            nonfatal("Unable to write random seed: write "
                     "returned '%s'", strerror(errno));
            break;
        }
        len -= ret;
        data = (char *)data + len;
    }

    close(fd);
    sfree(fname);
}